

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint32_t helper_unpku(CPUS390XState_conflict *env,uint64_t dest,uint32_t destlen,uint64_t src)

{
  uint32_t uVar1;
  uintptr_t unaff_retaddr;
  
  uVar1 = do_unpkau(env,dest,destlen,2,src,unaff_retaddr);
  return uVar1;
}

Assistant:

uint32_t HELPER(unpku)(CPUS390XState *env, uint64_t dest, uint32_t destlen,
                       uint64_t src)
{
    return do_unpkau(env, dest, destlen, 2, src, GETPC());
}